

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.h
# Opt level: O2

void __thiscall S1Interval::set_lo(S1Interval *this,double p)

{
  bool bVar1;
  S2LogMessage SStack_18;
  
  (this->bounds_).c_[0] = p;
  bVar1 = is_valid(this);
  if (bVar1) {
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.h"
             ,0xfe,kFatal,(ostream *)&std::cerr);
  std::operator<<(SStack_18.stream_,"Check failed: is_valid() ");
  abort();
}

Assistant:

inline void S1Interval::set_lo(double p) {
  bounds_[0] = p;
  S2_DCHECK(is_valid());
}